

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O1

vm_filnam_ext * vm_filnam_ext::alloc_ext(CVmObjFileName *self,int32_t sfid,char *str,size_t len)

{
  int iVar1;
  undefined4 extraout_var;
  uint16_t tmp;
  vm_filnam_ext *pvVar2;
  
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,len + 10,self);
  pvVar2 = (vm_filnam_ext *)CONCAT44(extraout_var,iVar1);
  pvVar2->sfid = sfid;
  pvVar2->sfid_valid = '\x01';
  pvVar2->from_ui = '\0';
  *(short *)pvVar2->str = (short)len;
  pvVar2[1].str[len - 6] = '\0';
  if (str != (char *)0x0) {
    memcpy(pvVar2 + 1,str,len);
  }
  return pvVar2;
}

Assistant:

vm_filnam_ext *vm_filnam_ext::alloc_ext(
    VMG_ CVmObjFileName *self, int32_t sfid, const char *str, size_t len)
{
    /* 
     *   Calculate how much space we need - we need space for the name string
     *   plus its length prefix; store the name string with a null terminator
     *   for convenience in calling osifc routines.
     */
    size_t siz = (sizeof(vm_filnam_ext)-1) + (VMB_LEN + len + 1);

    /* allocate the memory */
    vm_filnam_ext *ext = (vm_filnam_ext *)G_mem->get_var_heap()->alloc_mem(
        siz, self);

    /* store the special file ID; assume it's valid */
    ext->sfid = sfid;
    ext->sfid_valid = TRUE;

    /* assume that the file didn't come from a manual user interaction */
    ext->from_ui = 0;

    /* set the string length and null terminator */
    vmb_put_len(ext->str, len);
    ext->str[VMB_LEN + len] = '\0';

    /* copy the string, if provided */
    if (str != 0)
        memcpy(ext->str + VMB_LEN, str, len);

    /* return the new extension */
    return ext;
}